

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_edge_mixed(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_ADJ pRVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((((-1 < node1) &&
       ((pRVar1 = ref_grid->cell[9]->ref_adj, pRVar1->nnode <= node1 ||
        (bVar2 = pRVar1->first[(uint)node1] == -1, bVar2)))) &&
      ((pRVar1 = ref_grid->cell[10]->ref_adj, pRVar1->nnode <= node1 ||
       (bVar2 = pRVar1->first[(uint)node1] == -1, bVar2)))) &&
     ((pRVar1 = ref_grid->cell[0xb]->ref_adj, pRVar1->nnode <= node1 ||
      (bVar2 = pRVar1->first[(uint)node1] == -1, bVar2)))) {
    pRVar1 = ref_grid->cell[6]->ref_adj;
    bVar2 = true;
    if (node1 < pRVar1->nnode) {
      bVar2 = pRVar1->first[(uint)node1] == -1;
    }
  }
  *allowed = (uint)bVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_mixed(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  SUPRESS_UNUSED_COMPILER_WARNING(node0);

  *allowed = (ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node1) &&
              ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node1));

  return REF_SUCCESS;
}